

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O3

void __thiscall EhFrame::EhFrame(EhFrame *this,BYTE *buffer,size_t size)

{
  RegNum RVar1;
  LEB128Wrapper<unsigned_int> arg1;
  undefined1 local_30 [8];
  CIE cie;
  
  (this->writer).buffer = buffer;
  (this->writer).cur = buffer;
  (this->writer).size = size;
  (this->fde).super_Entry.writer = &this->writer;
  (this->fde).super_Entry.beginOffset = 0xffffffffffffffff;
  cie.super_Entry.writer = (Writer *)&DAT_ffffffffffffffff;
  local_30 = (undefined1  [8])this;
  CIE::Begin((CIE *)local_30);
  RVar1 = LowererMDArch::GetRegStackPointer();
  arg1.value._1_3_ = 0;
  arg1.value._0_1_ = DWARF_RegNum[RVar1];
  Entry::Emit<LEB128Wrapper<unsigned_int>,LEB128Wrapper<unsigned_int>>
            ((Entry *)local_30,'\f',arg1,(LEB128Wrapper<unsigned_int>)0x8);
  Writer::Write<unsigned_char>((Writer *)local_30,0x90);
  cie.super_Entry.beginOffset._4_4_ = 1;
  Writer::Write<unsigned_int>
            ((Writer *)local_30,
             (LEB128Wrapper<unsigned_int> *)((long)&cie.super_Entry.beginOffset + 4));
  Entry::End((Entry *)local_30);
  FDE::Begin(&this->fde);
  return;
}

Assistant:

EhFrame::EhFrame(BYTE* buffer, size_t size)
        : writer(buffer, size), fde(&writer)
{
    CIE cie(&writer);
    cie.Begin();

    // CIE initial instructions
    // DW_CFA_def_cfa: r7 (rsp) ofs 8
    cie.cfi_def_cfa(DWARF_RegNum[LowererMDArch::GetRegStackPointer()], MachPtr);
    // DW_CFA_offset: r16 (rip) at cfa-8 (data alignment -8)
    cie.cfi_offset(DWARF_RegRA, 1);

    cie.End();

    fde.Begin();
}